

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseServiceTest_MethodsAndStreams_Test::
~ParseServiceTest_MethodsAndStreams_Test(ParseServiceTest_MethodsAndStreams_Test *this)

{
  ZeroCopyInputStream *pZVar1;
  
  (this->super_ParseServiceTest).super_Test._vptr_Test = (_func_int **)&PTR__ParserTest_018d8b70;
  std::
  unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
  ::~unique_ptr(&(this->super_ParseServiceTest).parser_);
  std::
  unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
  ::~unique_ptr(&(this->super_ParseServiceTest).input_);
  pZVar1 = (this->super_ParseServiceTest).raw_input_._M_t.
           super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl;
  if (pZVar1 != (ZeroCopyInputStream *)0x0) {
    (*pZVar1->_vptr_ZeroCopyInputStream[1])();
  }
  (this->super_ParseServiceTest).raw_input_._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl =
       (ZeroCopyInputStream *)0x0;
  DescriptorPool::~DescriptorPool(&(this->super_ParseServiceTest).pool_);
  MockErrorCollector::~MockErrorCollector
            ((MockErrorCollector *)&(this->super_ParseServiceTest).error_collector_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseServiceTest, MethodsAndStreams) {
  ExpectParsesTo(
      "service TestService {\n"
      "  rpc Foo(In1) returns (Out1);\n"
      "  rpc Bar(In2) returns (Out2);\n"
      "  rpc Baz(In3) returns (Out3);\n"
      "}\n",

      "service {"
      "  name: \"TestService\""
      "  method { name:\"Foo\" input_type:\"In1\" output_type:\"Out1\" }"
      "  method { name:\"Bar\" input_type:\"In2\" output_type:\"Out2\" }"
      "  method { name:\"Baz\" input_type:\"In3\" output_type:\"Out3\" }"
      "}");
}